

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::interval_t,duckdb::interval_t,duckdb::UnaryOperatorWrapper,duckdb::NormalizedIntervalOperator>
               (interval_t *ldata,interval_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  interval_t input;
  interval_t input_00;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  interval_t iVar11;
  undefined8 in_stack_ffffffffffffffa8;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar4 = 8;
    while (bVar10 = count != 0, count = count - 1, bVar10) {
      iVar11.micros = (int64_t)mask;
      iVar11.months = (int)in_stack_ffffffffffffffa8;
      iVar11.days = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
      iVar11 = NormalizedIntervalOperator::Operation<duckdb::interval_t,duckdb::interval_t>(iVar11);
      *(long *)((long)result_data + lVar4 + -8) = iVar11._0_8_;
      *(int64_t *)((long)&result_data->months + lVar4) = iVar11.micros;
      lVar4 = lVar4 + 0x10;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    uVar8 = 0;
    for (uVar3 = 0; uVar3 != count + 0x3f >> 6; uVar3 = uVar3 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
LAB_01c896f4:
        uVar5 = uVar8 << 4 | 8;
        for (; uVar2 = uVar8, uVar8 < uVar9; uVar8 = uVar8 + 1) {
          input.micros = (int64_t)mask;
          input.months = (int)uVar3;
          input.days = (int)(uVar3 >> 0x20);
          iVar11 = NormalizedIntervalOperator::Operation<duckdb::interval_t,duckdb::interval_t>
                             (input);
          *(long *)((long)result_data + (uVar5 - 8)) = iVar11._0_8_;
          *(int64_t *)((long)&result_data->months + uVar5) = iVar11.micros;
          uVar5 = uVar5 + 0x10;
        }
      }
      else {
        uVar5 = puVar1[uVar3];
        uVar9 = uVar8 + 0x40;
        if (count <= uVar8 + 0x40) {
          uVar9 = count;
        }
        if (uVar5 == 0xffffffffffffffff) goto LAB_01c896f4;
        uVar2 = uVar9;
        if (uVar5 != 0) {
          uVar6 = uVar8 << 4 | 8;
          for (uVar7 = 0; uVar2 = uVar8 + uVar7, uVar8 + uVar7 < uVar9; uVar7 = uVar7 + 1) {
            if ((uVar5 >> (uVar7 & 0x3f) & 1) != 0) {
              input_00.micros = (int64_t)mask;
              input_00.months = (int)uVar3;
              input_00.days = (int)(uVar3 >> 0x20);
              iVar11 = NormalizedIntervalOperator::Operation<duckdb::interval_t,duckdb::interval_t>
                                 (input_00);
              *(long *)((long)result_data + (uVar6 - 8)) = iVar11._0_8_;
              *(int64_t *)((long)&result_data->months + uVar6) = iVar11.micros;
            }
            uVar6 = uVar6 + 0x10;
          }
        }
      }
      uVar8 = uVar2;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}